

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescue.c
# Opt level: O0

int help(void)

{
  int local_c;
  
  fprintf(_stderr,"rescue - A cross-platform resource compiler.\n\n");
  fprintf(_stderr,
          "Usage: rescue [-h] [-v] [-o <path>] [-a] [-b] [-r <path>] [-p <prefix>] <file1> ...\n");
  fprintf(_stderr," -h\t\tPrint help.\n");
  fprintf(_stderr," -v\t\tBe verbose.\n");
  fprintf(_stderr,
          " -o <path>\tOutput the resulting C source to the given file instead of printing it to standard output.\n\t\tThis flag can only be used before any source file is provided.\n"
         );
  fprintf(_stderr,
          " -a\t\tSet the naming mode of the files to absolute name.\n\t\tThe embedded names of the files will include the full absolute name of the file.\n"
         );
  fprintf(_stderr,
          " -b\t\tSet the naming mode of the files to file basename.\n\t\tThe embedded names of the files will include only the basename of the file.\n"
         );
  fprintf(_stderr,
          " -p <prefix>\tUse the following alphanumerical string as a prefix for the functions and\n\t\tvariables in the generated file (instead of `rescue`).\n\t\tThis flag can only be used before any source file is provided.\n"
         );
  fprintf(_stderr,"\n");
  return local_c;
}

Assistant:

int help()
{

    fprintf(stderr, "rescue - A cross-platform resource compiler.\n\n");
    fprintf(stderr, "Usage: rescue [-h] [-v] [-o <path>] [-a] [-b] [-r <path>] [-p <prefix>] <file1> ...\n");
    fprintf(stderr, " -h\t\tPrint help.\n");
    fprintf(stderr, " -v\t\tBe verbose.\n");
    fprintf(stderr, " -o <path>\tOutput the resulting C source to the given file instead of printing it to standard output.\n\t\tThis flag can only be used before any source file is provided.\n");
    // NOT IMPLEMENTED YET!
    //fprintf(stderr, " -r <path>\tSet the root direcotry for the following files.\n\t\tThe embedded names of the files will be relative to this path.\n");
    fprintf(stderr, " -a\t\tSet the naming mode of the files to absolute name.\n\t\tThe embedded names of the files will include the full absolute name of the file.\n");
    fprintf(stderr, " -b\t\tSet the naming mode of the files to file basename.\n\t\tThe embedded names of the files will include only the basename of the file.\n");
    fprintf(stderr, " -p <prefix>\tUse the following alphanumerical string as a prefix for the functions and\n\t\tvariables in the generated file (instead of `rescue`).\n\t\tThis flag can only be used before any source file is provided.\n");
    fprintf(stderr, "\n");

}